

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O1

void __thiscall
versionbits_tests::versionbits_computeblockversion::test_method
          (versionbits_computeblockversion *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  undefined4 *puVar3;
  long lVar4;
  uint uVar5;
  iterator in_R8;
  iterator in_R9;
  int iVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams_1;
  ArgsManager args;
  VersionBitsCache vbcache;
  check_type cVar7;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  undefined1 local_358 [8];
  string local_350;
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_320;
  undefined1 local_310 [584];
  __native_type local_c8;
  undefined4 local_98 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = local_98;
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  lVar4 = 0x60;
  do {
    *puVar3 = 0;
    *(undefined8 *)(puVar3 + 2) = 0;
    *(undefined4 **)(puVar3 + 4) = puVar3;
    *(undefined4 **)(puVar3 + 6) = puVar3;
    *(undefined8 *)(puVar3 + 8) = 0;
    puVar3 = puVar3 + 0xc;
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    CreateChainParams((ArgsManager *)local_358,
                      (ChainType)(this->super_BlockVersionTest).super_BasicTestingSetup.m_node.args)
    ;
    iVar6 = 0;
    uVar5 = 0;
    do {
      uVar2 = VersionBitsCache::Mask((Params *)local_358,(DeploymentPos)iVar6);
      local_368 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_360 = "";
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      local_370 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x1b6;
      file.m_begin = (iterator)&local_368;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_378,msg)
      ;
      local_330[0] = (uVar2 & uVar5) == 0;
      local_330._8_8_ = (element_type *)0x0;
      aStack_320._M_allocated_capacity = 0;
      local_350._M_dataplus._M_p = "!(chain_all_vbits & dep_mask)";
      local_350._M_string_length = (long)"!(chain_all_vbits & dep_mask)" + 0x1d;
      local_310[8] = false;
      local_310._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_310._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_310._24_8_ = &local_350;
      local_388 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/versionbits_tests.cpp"
      ;
      local_380 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_330,(lazy_ostream *)local_310,1,0,WARN,_cVar7,
                 (size_t)&local_388,0x1b6);
      boost::detail::shared_count::~shared_count((shared_count *)(local_330 + 0x10));
      BlockVersionTest::check_computeblockversion
                (&this->super_BlockVersionTest,(VersionBitsCache *)&local_c8.__data,
                 (Params *)local_358,(DeploymentPos)iVar6);
      uVar5 = uVar5 | uVar2;
      iVar6 = iVar6 + 1;
    } while (iVar6 == 1);
    std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
              ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_358
              );
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x14);
  ArgsManager::ArgsManager((ArgsManager *)local_310);
  local_330._0_8_ = local_330 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"-vbparams","");
  paVar1 = &local_350.field_2;
  local_350._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_350,"testdummy:1199145601:1230767999","");
  ArgsManager::ForceSetArg((ArgsManager *)local_310,(string *)local_330,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,(ulong)(local_350.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((Params *)local_330._0_8_ != (Params *)(local_330 + 0x10)) {
    operator_delete((void *)local_330._0_8_,(ulong)(aStack_320._M_allocated_capacity + 1));
  }
  CreateChainParams((ArgsManager *)local_330,(ChainType)local_310);
  BlockVersionTest::check_computeblockversion
            (&this->super_BlockVersionTest,(VersionBitsCache *)&local_c8.__data,
             (Params *)local_330._0_8_,DEPLOYMENT_TESTDUMMY);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_330);
  ArgsManager::~ArgsManager((ArgsManager *)local_310);
  ArgsManager::ArgsManager((ArgsManager *)local_310);
  local_330._0_8_ = local_330 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"-vbparams","");
  local_350._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_350,"testdummy:1199145601:1230767999:403200","");
  ArgsManager::ForceSetArg((ArgsManager *)local_310,(string *)local_330,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,(ulong)(local_350.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((Params *)local_330._0_8_ != (Params *)(local_330 + 0x10)) {
    operator_delete((void *)local_330._0_8_,(ulong)(aStack_320._M_allocated_capacity + 1));
  }
  CreateChainParams((ArgsManager *)local_330,(ChainType)local_310);
  BlockVersionTest::check_computeblockversion
            (&this->super_BlockVersionTest,(VersionBitsCache *)&local_c8.__data,
             (Params *)local_330._0_8_,DEPLOYMENT_TESTDUMMY);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_330);
  ArgsManager::~ArgsManager((ArgsManager *)local_310);
  lVar4 = 0x58;
  do {
    std::
    _Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
    ::~_Rb_tree((_Rb_tree<const_CBlockIndex_*,_std::pair<const_CBlockIndex_*const,_ThresholdState>,_std::_Select1st<std::pair<const_CBlockIndex_*const,_ThresholdState>_>,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>
                 *)((long)&local_c8 + lVar4));
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(versionbits_computeblockversion, BlockVersionTest)
{
    VersionBitsCache vbcache;

    // check that any deployment on any chain can conceivably reach both
    // ACTIVE and FAILED states in roughly the way we expect
    for (const auto& chain_type: {ChainType::MAIN, ChainType::TESTNET, ChainType::TESTNET4, ChainType::SIGNET, ChainType::REGTEST}) {
        const auto chainParams = CreateChainParams(*m_node.args, chain_type);
        uint32_t chain_all_vbits{0};
        for (int i = 0; i < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++i) {
            const auto dep = static_cast<Consensus::DeploymentPos>(i);
            // Check that no bits are reused (within the same chain). This is
            // disallowed because the transition to FAILED (on timeout) does
            // not take precedence over STARTED/LOCKED_IN. So all softforks on
            // the same bit might overlap, even when non-overlapping start-end
            // times are picked.
            const uint32_t dep_mask{vbcache.Mask(chainParams->GetConsensus(), dep)};
            BOOST_CHECK(!(chain_all_vbits & dep_mask));
            chain_all_vbits |= dep_mask;
            check_computeblockversion(vbcache, chainParams->GetConsensus(), dep);
        }
    }

    {
        // Use regtest/testdummy to ensure we always exercise some
        // deployment that's not always/never active
        ArgsManager args;
        args.ForceSetArg("-vbparams", "testdummy:1199145601:1230767999"); // January 1, 2008 - December 31, 2008
        const auto chainParams = CreateChainParams(args, ChainType::REGTEST);
        check_computeblockversion(vbcache, chainParams->GetConsensus(), Consensus::DEPLOYMENT_TESTDUMMY);
    }

    {
        // Use regtest/testdummy to ensure we always exercise the
        // min_activation_height test, even if we're not using that in a
        // live deployment
        ArgsManager args;
        args.ForceSetArg("-vbparams", "testdummy:1199145601:1230767999:403200"); // January 1, 2008 - December 31, 2008, min act height 403200
        const auto chainParams = CreateChainParams(args, ChainType::REGTEST);
        check_computeblockversion(vbcache, chainParams->GetConsensus(), Consensus::DEPLOYMENT_TESTDUMMY);
    }
}